

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeUnaryOp(ExpressionContext *ctx,SynUnaryOp *syntax)

{
  SynUnaryOpType type;
  undefined4 uVar1;
  TypeStruct *pTVar2;
  bool bVar3;
  int iVar4;
  ExprBase *arg0;
  SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U> *pSVar5;
  char *pcVar6;
  size_t sVar7;
  ExprBase *pEVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeStruct *type_00;
  TypeBase **key;
  InplaceStr name;
  
  arg0 = AnalyzeExpression(ctx,syntax->value);
  if ((arg0->type != (TypeBase *)0x0) && (arg0->type->typeID == 0)) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar4);
    type_00 = (TypeStruct *)ExpressionContext::GetErrorType(ctx);
    goto LAB_00163a08;
  }
  key = &arg0->type;
  pSVar5 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                     (&ctx->noUnaryOperatorForTypePair,
                      *(int *)&(syntax->super_SynBase).field_0x3c - 1);
  bVar3 = SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::contains(pSVar5,key);
  if (!bVar3) {
    pcVar6 = GetOpName(*(SynUnaryOpType *)&(syntax->super_SynBase).field_0x3c);
    sVar7 = strlen(pcVar6);
    name.end = pcVar6 + sVar7;
    name.begin = pcVar6;
    pEVar8 = CreateFunctionCall1(ctx,&syntax->super_SynBase,name,arg0,true,false,true);
    if (pEVar8 != (ExprBase *)0x0) {
      return pEVar8;
    }
    pSVar5 = FixedArray<SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>,_4U>::operator[]
                       (&ctx->noUnaryOperatorForTypePair,
                        *(int *)&(syntax->super_SynBase).field_0x3c - 1);
    SmallDenseSet<TypeBase_*,_TypeBaseHasher,_4U>::insert(pSVar5,key);
  }
  AssertValueExpression(ctx,&syntax->super_SynBase,arg0);
  type = *(SynUnaryOpType *)&(syntax->super_SynBase).field_0x3c;
  type_00 = (TypeStruct *)arg0->type;
  if (((TypeStruct *)ctx->typeFloat == type_00) || ((TypeStruct *)ctx->typeDouble == type_00)) {
    if (type - SYN_UNARY_OP_BIT_NOT < 2) goto LAB_001639b9;
LAB_001639a4:
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_00,iVar4);
  }
  else {
    pTVar2 = (TypeStruct *)ctx->typeBool;
    if (((type_00 == pTVar2) || (type_00 == ctx->typeAutoRef)) ||
       ((type_00 != (TypeStruct *)0x0 && ((type_00->super_TypeBase).typeID == 0x12)))) {
      if (type == SYN_UNARY_OP_LOGICAL_NOT) goto LAB_001639a1;
    }
    else {
      bVar3 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type_00);
      if (bVar3) {
        if (type != SYN_UNARY_OP_LOGICAL_NOT) goto LAB_001639a4;
LAB_001639a1:
        type_00 = pTVar2;
        goto LAB_001639a4;
      }
    }
LAB_001639b9:
    pcVar6 = GetOpName(type);
    anon_unknown.dwarf_b837c::Report
              (ctx,&syntax->super_SynBase,
               "ERROR: unary operation \'%s\' is not supported on \'%.*s\'",pcVar6,
               (ulong)(uint)(*(int *)&((*key)->name).end - (int)((*key)->name).begin));
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_01,iVar4);
    type_00 = (TypeStruct *)ExpressionContext::GetErrorType(ctx);
  }
LAB_00163a08:
  uVar1 = *(undefined4 *)&(syntax->super_SynBase).field_0x3c;
  pEVar8->typeID = 0x13;
  pEVar8->source = &syntax->super_SynBase;
  pEVar8->type = &type_00->super_TypeBase;
  pEVar8->next = (ExprBase *)0x0;
  pEVar8->listed = false;
  pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240d20;
  *(undefined4 *)&pEVar8->field_0x2c = uVar1;
  pEVar8[1]._vptr_ExprBase = (_func_int **)arg0;
  return pEVar8;
}

Assistant:

ExprBase* AnalyzeUnaryOp(ExpressionContext &ctx, SynUnaryOp *syntax)
{
	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);

	if(!ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].contains(value->type))
	{
		if(ExprBase *result = CreateFunctionCall1(ctx, syntax, InplaceStr(GetOpName(syntax->type)), value, true, false, true))
			return result;
		else
			ctx.noUnaryOperatorForTypePair[int(syntax->type) - 1].insert(value->type);
	}

	AssertValueExpression(ctx, syntax, value);

	bool binaryOp = IsBinaryOp(syntax->type);
	bool logicalOp = IsLogicalOp(syntax->type);

	// Type check
	if(ctx.IsFloatingPointType(value->type))
	{
		if(binaryOp || logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(value->type == ctx.typeBool || value->type == ctx.typeAutoRef)
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		if(!logicalOp)
		{
			Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
		}
	}
	else if(!ctx.IsNumericType(value->type))
	{
		Report(ctx, syntax, "ERROR: unary operation '%s' is not supported on '%.*s'", GetOpName(syntax->type), FMT_ISTR(value->type->name));

		return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, ctx.GetErrorType(), syntax->type, value);
	}

	TypeBase *resultType = NULL;

	if(logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = value->type;

	return new (ctx.get<ExprUnaryOp>()) ExprUnaryOp(syntax, resultType, syntax->type, value);
}